

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O2

void __thiscall Assimp::LWO::Layer::Layer(Layer *this)

{
  memset(this,0,0x90);
  NormalChannel::NormalChannel(&this->mNormals);
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mFaceIDXOfs = 0;
  this->mPointIDXOfs = 0;
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->mParent = 0;
  this->mIndex = 0xffff;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  (this->mName)._M_string_length = 0;
  (this->mName).field_2._M_local_buf[0] = '\0';
  (this->mPivot).x = 0.0;
  (this->mPivot).y = 0.0;
  *(undefined8 *)((long)&(this->mPivot).y + 1) = 0;
  return;
}

Assistant:

Layer()
        : mFaceIDXOfs   (0)
        , mPointIDXOfs  (0)
        , mParent       (0x0)
        , mIndex        (0xffff)
        , skip          (false)
    {}